

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::Or(VirtualMachine *this)

{
  bool bVar1;
  Variable VVar2;
  Variable VVar3;
  Variable var;
  Variable var_00;
  undefined1 local_51;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  var_00.field_1 = VVar2.field_1;
  VVar3 = popOpStack(this);
  var.field_1 = VVar3.field_1;
  var._4_4_ = 0;
  var.type = VVar3.type;
  bVar1 = booleanValueOfVariable(this,var);
  local_51 = true;
  if (!bVar1) {
    var_00._4_4_ = 0;
    var_00.type = VVar2.type;
    local_51 = booleanValueOfVariable(this,var_00);
  }
  pushBoolean(this,local_51);
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::Or() {
 Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(
    this->booleanValueOfVariable(first)
    ||
    this->booleanValueOfVariable(second)
  );
  this->advance();
}